

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

void pair1_send_sched(pair1_sock *s)

{
  _Bool _Var1;
  int iVar2;
  size_t local_30;
  size_t l;
  nni_aio *a;
  nni_msg *m;
  pair1_pipe *p;
  pair1_sock *s_local;
  
  local_30 = 0;
  p = (pair1_pipe *)s;
  nni_mtx_lock(&s->mtx);
  m = (nni_msg *)(p->aio_send).a_count;
  if (m == (nni_msg *)0x0) {
    nni_mtx_unlock((nni_mtx *)&(p->aio_send).a_timeout);
  }
  else {
    *(undefined1 *)((long)&(p->aio_send).a_iov[6].iov_len + 1) = 1;
    iVar2 = nni_lmq_get((nni_lmq *)&(p->aio_send).a_task.task_cb,(nng_msg **)&a);
    if (iVar2 == 0) {
      pair1_pipe_send((pair1_pipe *)m,(nni_msg *)a);
      l = (size_t)nni_list_first((nni_list *)((long)&(p->aio_send).a_task.task_cv.cv + 8));
      if ((nni_aio *)l != (nni_aio *)0x0) {
        nni_aio_list_remove((nni_aio *)l);
        a = (nni_aio *)nni_aio_get_msg((nni_aio *)l);
        local_30 = nni_msg_len((nni_msg *)a);
        nni_lmq_put((nni_lmq *)&(p->aio_send).a_task.task_cb,(nng_msg *)a);
      }
    }
    else {
      l = (size_t)nni_list_first((nni_list *)((long)&(p->aio_send).a_task.task_cv.cv + 8));
      if ((nni_aio *)l != (nni_aio *)0x0) {
        nni_aio_list_remove((nni_aio *)l);
        a = (nni_aio *)nni_aio_get_msg((nni_aio *)l);
        local_30 = nni_msg_len((nni_msg *)a);
        pair1_pipe_send((pair1_pipe *)m,(nni_msg *)a);
      }
    }
    _Var1 = nni_lmq_full((nni_lmq *)&(p->aio_send).a_task.task_cb);
    if ((!_Var1) || (((p->aio_send).a_iov[6].iov_len & 0x100) != 0)) {
      nni_pollable_raise((nni_pollable *)&(p->aio_send).a_iov[4].iov_len);
    }
    nni_mtx_unlock((nni_mtx *)&(p->aio_send).a_timeout);
    if (l != 0) {
      nni_aio_set_msg((nni_aio *)l,(nni_msg *)0x0);
      nni_aio_finish_sync((nni_aio *)l,NNG_OK,local_30);
    }
  }
  return;
}

Assistant:

static void
pair1_send_sched(pair1_sock *s)
{
	pair1_pipe *p;
	nni_msg    *m;
	nni_aio    *a = NULL;
	size_t      l = 0;

	nni_mtx_lock(&s->mtx);

	if ((p = s->p) == NULL) {
		nni_mtx_unlock(&s->mtx);
		return;
	}

	s->wr_ready = true;

	// if message waiting in buffered queue, then we prefer that.
	if (nni_lmq_get(&s->wmq, &m) == 0) {
		pair1_pipe_send(p, m);

		if ((a = nni_list_first(&s->waq)) != NULL) {
			nni_aio_list_remove(a);
			m = nni_aio_get_msg(a);
			l = nni_msg_len(m);
			nni_lmq_put(&s->wmq, m);
		}

	} else if ((a = nni_list_first(&s->waq)) != NULL) {
		// Looks like we had the unbuffered case, but
		// someone was waiting.
		nni_aio_list_remove(a);

		m = nni_aio_get_msg(a);
		l = nni_msg_len(m);
		pair1_pipe_send(p, m);
	}

	// if we were blocked before, but not now, update.
	if ((!nni_lmq_full(&s->wmq)) || s->wr_ready) {
		nni_pollable_raise(&s->writable);
	}

	nni_mtx_unlock(&s->mtx);

	if (a != NULL) {
		nni_aio_set_msg(a, NULL);
		nni_aio_finish_sync(a, 0, l);
	}
}